

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_integer_subtract(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  undefined8 uVar1;
  size_t sVar2;
  uint32_t uVar3;
  ulong uVar4;
  sysbvm_tuple_t sVar5;
  uint32_t *rightWords;
  uint uVar6;
  size_t rightWordCount;
  uint32_t *leftWords;
  uint uVar7;
  size_t leftWordCount;
  size_t resultWordCount_00;
  size_t resultWordCount_1;
  long value;
  sysbvm_object_tuple_t *psVar8;
  size_t resultWordCount;
  sysbvm_decoded_integer_t decodedRightInteger;
  sysbvm_decoded_integer_t decodedLeftInteger;
  sysbvm_decoded_integer_t local_78;
  sysbvm_decoded_integer_t local_58;
  
  if ((right & 0xf) == 0 || (left & 0xf) == 0) {
    local_58.words = (uint32_t *)0x0;
    local_58.inlineWordBuffer[0] = 0;
    local_58.inlineWordBuffer[1] = 0;
    local_58._0_8_ = 0;
    local_58.wordCount = 0;
    local_78.words = (uint32_t *)0x0;
    local_78.inlineWordBuffer[0] = 0;
    local_78.inlineWordBuffer[1] = 0;
    local_78.isNegative = false;
    local_78._1_7_ = 0;
    local_78.wordCount = 0;
    sysbvm_integer_decodeLargeOrImmediate(context,&local_58,left);
    sysbvm_integer_decodeLargeOrImmediate(context,&local_78,right);
    sVar2 = local_58.wordCount;
    uVar1 = local_58._0_8_;
    resultWordCount_00 = local_78.wordCount;
    if (local_58.isNegative == local_78.isNegative) {
      uVar4 = local_78.wordCount;
      if (local_78.wordCount < local_58.wordCount) {
        uVar4 = local_58.wordCount;
      }
      do {
        if (uVar4 == 0) {
          return 1;
        }
        uVar4 = uVar4 - 1;
        uVar6 = 0;
        uVar7 = 0;
        if (uVar4 < local_58.wordCount) {
          uVar7 = local_58.words[uVar4];
        }
        if (uVar4 < local_78.wordCount) {
          uVar6 = local_78.words[uVar4];
        }
        if (uVar7 < uVar6) {
          psVar8 = sysbvm_context_allocateByteTuple
                             (context,(&(context->roots).largePositiveIntegerType)
                                      [local_58._0_8_ & 0xff],local_78.wordCount * 4);
          rightWords = local_58.words;
          rightWordCount = local_58.wordCount;
          leftWords = local_78.words;
          leftWordCount = local_78.wordCount;
          goto LAB_0011ec00;
        }
      } while (uVar7 <= uVar6);
      psVar8 = sysbvm_context_allocateByteTuple
                         (context,(&(context->roots).largePositiveIntegerType)
                                  [local_58._0_8_ & 0xff],local_58.wordCount * 4);
      rightWords = local_78.words;
      rightWordCount = local_78.wordCount;
      leftWords = local_58.words;
      leftWordCount = local_58.wordCount;
      resultWordCount_00 = sVar2;
LAB_0011ec00:
      sysbvm_integer_subtractFromInto
                (leftWordCount,leftWords,rightWordCount,rightWords,resultWordCount_00,
                 (uint32_t *)(psVar8->field_1).pointers);
      psVar8 = (sysbvm_object_tuple_t *)sysbvm_integer_normalize(context,(sysbvm_integer_t *)psVar8)
      ;
    }
    else {
      uVar3 = sysbvm_integer_sumInto
                        (local_58.wordCount,local_58.words,local_78.wordCount,local_78.words,0,
                         (uint32_t *)0x0);
      if (resultWordCount_00 < sVar2) {
        resultWordCount_00 = sVar2;
      }
      psVar8 = sysbvm_context_allocateByteTuple
                         (context,(&(context->roots).largePositiveIntegerType)[uVar1 & 0xff],
                          (uVar3 + resultWordCount_00) * 4);
      sysbvm_integer_sumInto
                (local_58.wordCount,local_58.words,local_78.wordCount,local_78.words,
                 uVar3 + resultWordCount_00,(uint32_t *)(psVar8->field_1).pointers);
    }
  }
  else {
    value = ((long)left >> 4) - ((long)right >> 4);
    if (value + 0x800000000000000U >> 0x3c != 0) {
      sVar5 = sysbvm_tuple_integer_encodeBigInt64(context,value);
      return sVar5;
    }
    psVar8 = (sysbvm_object_tuple_t *)(value * 0x10 + 1);
  }
  return (sysbvm_tuple_t)psVar8;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_subtract(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_tuple_isImmediate(left) && sysbvm_tuple_isImmediate(right))
    {
        sysbvm_stuple_t leftValue = sysbvm_tuple_integer_decodeSmall(left);
        sysbvm_stuple_t rightValue = sysbvm_tuple_integer_decodeSmall(right);
        return sysbvm_tuple_integer_encodeInt64(context, leftValue - rightValue);
    }

    sysbvm_decoded_integer_t decodedLeftInteger = {0};
    sysbvm_decoded_integer_t decodedRightInteger = {0};
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedLeftInteger, left);
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedRightInteger, right);

    if(decodedLeftInteger.isNegative == decodedRightInteger.isNegative)
    {
        // Same sign, subtract.
        int magnitudeComparison = sysbvm_integer_compareMagnitudes(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words);
        if(magnitudeComparison == 0)
            return sysbvm_tuple_integer_encodeSmall(0);

        if(magnitudeComparison > 0)
        {
            size_t resultWordCount = decodedLeftInteger.wordCount;
            bool resultIsNegative = decodedLeftInteger.isNegative;
            sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, resultIsNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
            sysbvm_integer_subtractFromInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, resultWordCount, result->words);
            return sysbvm_integer_normalize(context, result);
        }
        else
        {
            size_t resultWordCount = decodedRightInteger.wordCount;
            bool resultIsNegative = decodedRightInteger.isNegative;
            sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, resultIsNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
            sysbvm_integer_subtractFromInto(decodedRightInteger.wordCount, decodedRightInteger.words, decodedLeftInteger.wordCount, decodedLeftInteger.words, resultWordCount, result->words);
            return sysbvm_integer_normalize(context, result);
        }
    }
    else
    {
        // Differing sign, sum
        uint32_t carry = sysbvm_integer_sumInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, 0, NULL);
        size_t resultWordCount = (decodedLeftInteger.wordCount > decodedRightInteger.wordCount) ? decodedLeftInteger.wordCount : decodedRightInteger.wordCount;
        if(carry != 0)
            ++resultWordCount;

        sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, decodedLeftInteger.isNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
        sysbvm_integer_sumInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, resultWordCount, result->words);
        return (sysbvm_tuple_t)result;
    }
}